

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

shared_ptr<Token> __thiscall Lexer::scan(Lexer *this)

{
  char cVar1;
  int iVar2;
  pointer ppVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  Lexer *in_RSI;
  bool bVar5;
  shared_ptr<Token> sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined4 local_254;
  string local_250 [32];
  undefined1 local_230 [8];
  shared_ptr<Word> w;
  _Self local_218;
  key_type local_210;
  _Self local_1f0;
  iterator result;
  stringstream local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [376];
  shared_ptr<Real> local_50;
  float local_40;
  float local_3c;
  float d;
  float x;
  int local_24;
  undefined1 local_1e;
  undefined1 local_1d;
  int v;
  Lexer *this_local;
  shared_ptr<Token> *t;
  
  this_local = this;
  do {
    if (((in_RSI->peek != ' ') && (in_RSI->peek != '\t')) && (in_RSI->peek != '\r')) {
      if (in_RSI->peek != '\n') {
        cVar1 = in_RSI->peek;
        if (cVar1 == '!') {
          bVar5 = readch(in_RSI,'=');
          if (bVar5) {
            std::shared_ptr<Token>::shared_ptr<Word,void>((shared_ptr<Token> *)this,&Word::Ne);
            _Var4._M_pi = extraout_RDX_02;
          }
          else {
            v._0_1_ = 0x21;
            sVar6 = std::make_shared<Token,char>(&this->peek);
            _Var4 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          }
        }
        else if (cVar1 == '&') {
          bVar5 = readch(in_RSI,'&');
          if (bVar5) {
            std::shared_ptr<Token>::shared_ptr<Word,void>((shared_ptr<Token> *)this,&Word::And);
            _Var4._M_pi = extraout_RDX;
          }
          else {
            v._3_1_ = 0x26;
            sVar6 = std::make_shared<Token,char>(&this->peek);
            _Var4 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          }
        }
        else if (cVar1 == '<') {
          bVar5 = readch(in_RSI,'=');
          if (bVar5) {
            std::shared_ptr<Token>::shared_ptr<Word,void>((shared_ptr<Token> *)this,&Word::Le);
            _Var4._M_pi = extraout_RDX_03;
          }
          else {
            local_1d = 0x3c;
            sVar6 = std::make_shared<Token,char>(&this->peek);
            _Var4 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          }
        }
        else if (cVar1 == '=') {
          bVar5 = readch(in_RSI,'=');
          if (bVar5) {
            std::shared_ptr<Token>::shared_ptr<Word,void>((shared_ptr<Token> *)this,&Word::Eq);
            _Var4._M_pi = extraout_RDX_01;
          }
          else {
            v._1_1_ = 0x3d;
            sVar6 = std::make_shared<Token,char>(&this->peek);
            _Var4 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          }
        }
        else if (cVar1 == '>') {
          bVar5 = readch(in_RSI,'=');
          if (bVar5) {
            std::shared_ptr<Token>::shared_ptr<Word,void>((shared_ptr<Token> *)this,&Word::Ge);
            _Var4._M_pi = extraout_RDX_04;
          }
          else {
            local_1e = 0x3e;
            sVar6 = std::make_shared<Token,char>(&this->peek);
            _Var4 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          }
        }
        else if (cVar1 == '|') {
          bVar5 = readch(in_RSI,'\"');
          if (bVar5) {
            std::shared_ptr<Token>::shared_ptr<Word,void>((shared_ptr<Token> *)this,&Word::Or);
            _Var4._M_pi = extraout_RDX_00;
          }
          else {
            v._2_1_ = 0x7c;
            sVar6 = std::make_shared<Token,char>(&this->peek);
            _Var4 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          }
        }
        else {
          iVar2 = isdigit((int)in_RSI->peek);
          if (iVar2 == 0) {
            iVar2 = isalpha((int)in_RSI->peek);
            if (iVar2 == 0) {
              sVar6 = std::make_shared<Token,char&>(&this->peek);
              _Var4 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              in_RSI->peek = ' ';
            }
            else {
              std::__cxx11::stringstream::stringstream(local_1d8);
              do {
                std::operator<<(local_1c8,in_RSI->peek);
                readch(in_RSI);
                iVar2 = isalpha((int)in_RSI->peek);
                bVar5 = true;
                if (iVar2 == 0) {
                  iVar2 = isdigit((int)in_RSI->peek);
                  bVar5 = iVar2 != 0;
                }
              } while (bVar5);
              std::__cxx11::stringstream::str();
              local_1f0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                   ::find(&in_RSI->words,&local_210);
              std::__cxx11::string::~string((string *)&local_210);
              local_218._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                   ::end(&in_RSI->words);
              bVar5 = std::operator!=(&local_1f0,&local_218);
              if (bVar5) {
                ppVar3 = std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>
                         ::operator->(&local_1f0);
                std::shared_ptr<Token>::shared_ptr<Word,void>
                          ((shared_ptr<Token> *)this,&ppVar3->second);
                w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
              }
              else {
                std::__cxx11::stringstream::str();
                local_254 = 0x108;
                std::make_shared<Word,std::__cxx11::string,Tag>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_230,(Tag *)local_250);
                std::__cxx11::string::~string(local_250);
                std::__cxx11::stringstream::str();
                std::
                map<std::__cxx11::string,std::shared_ptr<Word>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>>
                ::emplace<std::__cxx11::string,std::shared_ptr<Word>&>
                          ((map<std::__cxx11::string,std::shared_ptr<Word>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>>
                            *)&in_RSI->words,&local_278,(shared_ptr<Word> *)local_230);
                std::__cxx11::string::~string((string *)&local_278);
                std::shared_ptr<Token>::shared_ptr<Word,void>
                          ((shared_ptr<Token> *)this,(shared_ptr<Word> *)local_230);
                w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
                std::shared_ptr<Word>::~shared_ptr((shared_ptr<Word> *)local_230);
              }
              std::__cxx11::stringstream::~stringstream(local_1d8);
              _Var4._M_pi = extraout_RDX_07;
            }
          }
          else {
            local_24 = 0;
            do {
              iVar2 = local_24 * 10;
              local_24 = toDigit(in_RSI,in_RSI->peek);
              local_24 = iVar2 + local_24;
              readch(in_RSI);
              iVar2 = isdigit((int)in_RSI->peek);
            } while (iVar2 != 0);
            if (in_RSI->peek == '.') {
              local_3c = (float)local_24;
              local_40 = 10.0;
              while( true ) {
                readch(in_RSI);
                iVar2 = isdigit((int)in_RSI->peek);
                if (iVar2 == 0) break;
                iVar2 = toDigit(in_RSI,in_RSI->peek);
                local_3c = (float)iVar2 / local_40 + local_3c;
                local_40 = local_40 * 10.0;
              }
              std::make_shared<Real,float&>((float *)&local_50);
              std::shared_ptr<Token>::shared_ptr<Real,void>((shared_ptr<Token> *)this,&local_50);
              std::shared_ptr<Real>::~shared_ptr(&local_50);
              _Var4._M_pi = extraout_RDX_06;
            }
            else {
              std::make_shared<Num,int&>((int *)&d);
              std::shared_ptr<Token>::shared_ptr<Num,void>
                        ((shared_ptr<Token> *)this,(shared_ptr<Num> *)&d);
              std::shared_ptr<Num>::~shared_ptr((shared_ptr<Num> *)&d);
              _Var4._M_pi = extraout_RDX_05;
            }
          }
        }
        sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
        sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
        return (shared_ptr<Token>)sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
      }
      line = line + 1;
    }
    readch(in_RSI);
  } while( true );
}

Assistant:

std::shared_ptr<Token> scan() {

		// Skip whitespace characters
		for (;; readch()) {
			if (peek == ' ' || peek == '\t' || peek == '\r') continue;
			else if (peek == '\n') line++;
			else break;
		}

		// Recognize complex tokens that consist of two or more characters
		switch (peek)
		{
		case '&':
			if (readch('&')) return Word::And;
			else return std::make_shared<Token>('&');
			break;
		case '|':
			if (readch('"')) return Word::Or;
			else return std::make_shared<Token>('|');
			break;
		case '=':
			if (readch('=')) return Word::Eq;
			else return std::make_shared<Token>('=');
			break;
		case '!':
			if (readch('=')) return Word::Ne;
			else return std::make_shared<Token>('!');
			break;
		case '<':
			if (readch('=')) return Word::Le;
			else return std::make_shared<Token>('<');
			break;
		case '>':
			if (readch('=')) return Word::Ge;
			else return std::make_shared<Token>('>');
			break;
		default:
			break;
		}

		// Number recognition
		if (std::isdigit(peek)) {
			int v = 0;
			do {
				v = v * 10 + toDigit(peek); readch();
			} while (std::isdigit(peek));

			if (peek != '.') return  std::make_shared<Num>(v);
			float x = (float)v; float d = 10.f;

			for (;;) {
				readch();
				if (!std::isdigit(peek)) break;
				x += toDigit(peek) / d; d *= 10;
			}
			return std::make_shared<Real>(x);
		}

		// String recognition
		if (std::isalpha(peek)) {
			std::stringstream ss;
			do {
				ss << peek; readch();
			} while (std::isalpha(peek) || std::isdigit(peek));
			auto result = words.find(ss.str());
			if (result != words.end()) return result->second;
			std::shared_ptr<Word> w = std::make_shared<Word>(ss.str(), ID);
			words.emplace(ss.str(), w);
			return w;
		}

		// Other tokens recognition
		std::shared_ptr<Token> t = std::make_shared<Token>(peek);
		peek = ' ';
		return t;
	}